

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_CCtx_loadDictionary_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_allocFunction p_Var1;
  void *__dest;
  
  if (cctx->streamStage != zcss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_clearAllDicts(cctx);
  if (dictSize != 0 && dict != (void *)0x0) {
    if (dictLoadMethod != ZSTD_dlm_byRef) {
      if (cctx->staticSize != 0) {
        return 0xffffffffffffffc0;
      }
      p_Var1 = (cctx->customMem).customAlloc;
      if (p_Var1 == (ZSTD_allocFunction)0x0) {
        __dest = malloc(dictSize);
      }
      else {
        __dest = (*p_Var1)((cctx->customMem).opaque,dictSize);
      }
      if (__dest == (void *)0x0) {
        return 0xffffffffffffffc0;
      }
      switchD_00b1522a::default(__dest,dict,dictSize);
      (cctx->localDict).dictBuffer = __dest;
      dict = __dest;
    }
    (cctx->localDict).dict = dict;
    (cctx->localDict).dictSize = dictSize;
    (cctx->localDict).dictContentType = dictContentType;
  }
  return 0;
}

Assistant:

size_t ZSTD_CCtx_loadDictionary_advanced(
        ZSTD_CCtx* cctx,
        const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod,
        ZSTD_dictContentType_e dictContentType)
{
    DEBUGLOG(4, "ZSTD_CCtx_loadDictionary_advanced (size: %u)", (U32)dictSize);
    RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                    "Can't load a dictionary when cctx is not in init stage.");
    ZSTD_clearAllDicts(cctx);  /* erase any previously set dictionary */
    if (dict == NULL || dictSize == 0)  /* no dictionary */
        return 0;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
        cctx->localDict.dict = dict;
    } else {
        /* copy dictionary content inside CCtx to own its lifetime */
        void* dictBuffer;
        RETURN_ERROR_IF(cctx->staticSize, memory_allocation,
                        "static CCtx can't allocate for an internal copy of dictionary");
        dictBuffer = ZSTD_customMalloc(dictSize, cctx->customMem);
        RETURN_ERROR_IF(dictBuffer==NULL, memory_allocation,
                        "allocation failed for dictionary content");
        ZSTD_memcpy(dictBuffer, dict, dictSize);
        cctx->localDict.dictBuffer = dictBuffer;  /* owned ptr to free */
        cctx->localDict.dict = dictBuffer;        /* read-only reference */
    }
    cctx->localDict.dictSize = dictSize;
    cctx->localDict.dictContentType = dictContentType;
    return 0;
}